

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O0

uint8 ecx_parentport(ecx_contextt *context,uint16 parent)

{
  byte local_14;
  uint8 local_13;
  uint8 b;
  uint8 parentport;
  uint16 parent_local;
  ecx_contextt *context_local;
  
  local_14 = context->slavelist[parent].consumedports;
  if ((local_14 & 8) == 0) {
    if ((local_14 & 2) == 0) {
      if ((local_14 & 4) == 0) {
        if ((local_14 & 1) != 0) {
          local_14 = local_14 & 0xfe;
        }
        local_13 = '\0';
      }
      else {
        local_13 = '\x02';
        local_14 = local_14 & 0xfb;
      }
    }
    else {
      local_13 = '\x01';
      local_14 = local_14 & 0xfd;
    }
  }
  else {
    local_13 = '\x03';
    local_14 = local_14 & 0xf7;
  }
  context->slavelist[parent].consumedports = local_14;
  return local_13;
}

Assistant:

static uint8 ecx_parentport(ecx_contextt *context, uint16 parent)
{
   uint8 parentport = 0;
   uint8 b;
   /* search order is important, here 3 - 1 - 2 - 0 */
   b = context->slavelist[parent].consumedports;
   if (b & PORTM3)
   {
      parentport = 3;
      b &= (uint8)~PORTM3;
   }
   else if (b & PORTM1)
   {
      parentport = 1;
      b &= (uint8)~PORTM1;
   }
   else if (b & PORTM2)
   {
      parentport = 2;
      b &= (uint8)~PORTM2;
   }
   else if (b & PORTM0)
   {
      parentport = 0;
      b &= (uint8)~PORTM0;
   }
   context->slavelist[parent].consumedports = b;
   return parentport;
}